

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-graph.hxx
# Opt level: O1

void __thiscall lineage::ProblemGraph::ProblemGraph(ProblemGraph *this,Problem *problem)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_01;
  int iVar1;
  iterator iVar2;
  iterator __position;
  pointer pvVar3;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this_02;
  ulong uVar4;
  runtime_error *this_03;
  pointer pAVar5;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar6;
  ulong uVar7;
  pointer pNVar8;
  pointer pEVar9;
  value_type local_58;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_38;
  
  this->problem_ = problem;
  local_38 = &this->graph_;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph_).multipleEdgesEnabled_ = false;
  this_00 = &this->nodeIndicesInFrame_;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar8 = (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
      super__Vector_impl_data._M_finish == pNVar8) {
    pAVar5 = (pointer)0x0;
  }
  else {
    do {
      pAVar5 = local_58.vector_.
               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (ulong)pNVar8[(long)local_58.vector_.
                                  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start].t;
      uVar4 = ((long)(this->nodeIndicesInFrame_).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodeIndicesInFrame_).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (uVar4 < uVar7 || uVar4 - uVar7 == 0) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::resize(this_00,uVar7 + 1);
      }
      this_01 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                ((this_00->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + pNVar8[(long)pAVar5].t);
      iVar2._M_current = *(unsigned_long **)(this_01 + 8);
      if (iVar2._M_current == *(unsigned_long **)(this_01 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_01,iVar2,(unsigned_long *)&local_58);
      }
      else {
        *iVar2._M_current =
             (unsigned_long)
             local_58.vector_.
             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(unsigned_long **)(this_01 + 8) = iVar2._M_current + 1;
      }
      local_58.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(local_58.vector_.
                             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertex_ + 1);
      pNVar8 = (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar5 = (pointer)(((long)(problem->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3) *
                        -0x5555555555555555);
    } while (local_58.vector_.
             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start < pAVar5);
  }
  this_02 = local_38;
  __position._M_current =
       (this->graph_).vertices_.
       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this->numberOfFrames_ =
       ((long)(this->nodeIndicesInFrame_).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->nodeIndicesInFrame_).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_58.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ::_M_fill_insert(&local_38->vertices_,__position,(size_type)pAVar5,&local_58);
  if (local_58.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->edgeIndicesInFrame_,this->numberOfFrames_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->edgeIndicesFromFrame_,this->numberOfFrames_ - 1);
  local_58.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar9 = (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar9) {
    do {
      pAVar5 = local_58.vector_.
               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = pEVar9[(long)local_58.vector_.
                           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start].t0;
      pvVar6 = &this->edgeIndicesInFrame_;
      if ((iVar1 != pEVar9[(long)local_58.vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start].t1) &&
         (pvVar6 = &this->edgeIndicesFromFrame_,
         iVar1 + 1 !=
         pEVar9[(long)local_58.vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start].t1)) {
        this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_03,"edge is not directed to next frame.");
        __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar3 = (pvVar6->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar2._M_current =
           *(pointer *)
            ((long)&pvVar3[iVar1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&pvVar3[iVar1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar3 + iVar1),iVar2,
                   (unsigned_long *)&local_58);
      }
      else {
        *iVar2._M_current =
             (unsigned_long)
             local_58.vector_.
             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(unsigned_long **)
         ((long)&pvVar3[iVar1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
      }
      pEVar9 = pEVar9 + (long)pAVar5;
      pvVar3 = (this_00->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                (this_02,*(size_t *)
                          (*(long *)&pvVar3[pEVar9->t0].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + (long)pEVar9->v0 * 8),
                 *(size_t *)
                  (*(long *)&pvVar3[pEVar9->t1].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + (long)pEVar9->v1 * 8));
      local_58.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(local_58.vector_.
                             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertex_ + 1);
      pEVar9 = (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (local_58.vector_.
             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start <
             (pointer)(((long)(problem->edges).
                              super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 3) *
                      -0x5555555555555555));
  }
  return;
}

Assistant:

ProblemGraph(Problem const& problem)
      : problem_(problem)
    {
        for (size_t j = 0; j < problem.nodes.size(); ++j) {
            auto const& node = problem.nodes[j];
            if (node.t >= nodeIndicesInFrame_.size())
                nodeIndicesInFrame_.resize(node.t + 1);

            nodeIndicesInFrame_[node.t].push_back(j);
        }

        numberOfFrames_ = nodeIndicesInFrame_.size();

        graph_.insertVertices(problem.nodes.size());

        edgeIndicesInFrame_.resize(numberOfFrames_);
        edgeIndicesFromFrame_.resize(numberOfFrames_ - 1);

        for (size_t j = 0; j < problem.edges.size(); ++j) {
            auto const& edge = problem.edges[j];

            if (edge.t0 == edge.t1)
                edgeIndicesInFrame_[edge.t0].push_back(j);
            else {
                if (edge.t0 + 1 != edge.t1)
                    throw std::runtime_error(
                        "edge is not directed to next frame.");

                edgeIndicesFromFrame_[edge.t0].push_back(j);
            }

            graph_.insertEdge(nodeIndicesInFrame_[edge.t0][edge.v0],
                              nodeIndicesInFrame_[edge.t1][edge.v1]);
        }
    }